

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O2

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
__thiscall
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
scanMul(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
        *__return_storage_ptr__,
       FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
       *this,AbstractingUnifier *au,Numeral *k,TermSpec t)

{
  bool bVar1;
  int local_e4;
  TermSpec local_e0;
  RationalConstantType local_d0;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_b0
  ;
  
  local_e0.index = (int)t.term._content;
  local_e0.term._content = (uint64_t)k;
  RationalConstantType::RationalConstantType(&local_d0,(RationalConstantType *)au);
  local_e4 = 0;
  bVar1 = Kernel::operator==(&local_d0,&local_e4);
  if (bVar1) {
    zero();
  }
  else {
    scan(&local_b0,(AbstractingUnifier *)this,&local_e0);
    mul(__return_storage_ptr__,(AbstractingUnifier *)this,(Numeral *)au,&local_b0);
    ~FloorUwaState(&local_b0);
  }
  RationalConstantType::~RationalConstantType(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState scanMul(AbstractingUnifier& au, Numeral const& k, TermSpec t) 
  { return k == 0 ? FloorUwaState::zero() : mul(au, k, scan(au, t)); }